

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::_update_saliency(Group *this,GroupState *state,View *view)

{
  atomic_int_fast64_t *paVar1;
  Code *object;
  SyncMode SVar2;
  uint64_t ijt;
  float fVar3;
  float fVar4;
  P<r_exec::View> local_30;
  double local_28;
  double local_20;
  
  fVar3 = View::get_sln(view);
  local_20 = state->former_sln_thr;
  local_28 = update_sln(this,view);
  fVar4 = get_sln_thr(this);
  if (state->is_c_salient != true) {
    return;
  }
  if (((double)fVar4 < local_28) &&
     (SVar2 = View::get_sync(view), SVar2 < (SYNC_ONCE_AXIOM|SYNC_PERIODIC))) {
    if ((0x13U >> (SVar2 & 0x1f) & 1) == 0) {
      ijt = (*Now)();
      r_code::View::set_ijt(&view->super_View,ijt);
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_30.object = (_Object *)view;
      std::
      _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
      ::_M_insert_equal<core::P<r_exec::View>>
                ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                  *)&this->newly_salient_views,&local_30);
    }
    else {
      if (local_20 < (double)fVar3) goto LAB_001820e1;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_30.object = (_Object *)view;
      std::
      _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
      ::_M_insert_equal<core::P<r_exec::View>>
                ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                  *)&this->newly_salient_views,&local_30);
    }
    core::P<r_exec::View>::~P(&local_30);
  }
LAB_001820e1:
  if (state->is_c_active == true) {
    object = (Code *)(view->super_View).object.object;
    local_28 = local_28 - (double)fVar3;
    fVar3 = get_sln_thr(this);
    _initiate_sln_propagation(this,object,local_28,(double)fVar3);
  }
  return;
}

Assistant:

void Group::_update_saliency(GroupState *state, View *view)
{
    double view_old_sln = view->get_sln();
    bool wiew_was_salient = view_old_sln > state->former_sln_thr;
    double view_new_sln = update_sln(view);
    bool wiew_is_salient = view_new_sln > get_sln_thr();

    if (state->is_c_salient) {
        if (wiew_is_salient) {
            switch (view->get_sync()) {
            case View::SYNC_ONCE:
            case View::SYNC_ONCE_AXIOM:
            case View::SYNC_PERIODIC:
                if (!wiew_was_salient) { // sync on front: crosses the threshold upward: record as a newly salient view.
                    newly_salient_views.insert(view);
                }

                break;

            case View::SYNC_HOLD:
            case View::SYNC_AXIOM: // sync on state: treat as if it was a new injection.
                view->set_ijt(Now());
                newly_salient_views.insert(view);
                break;
            }
        }

        // inject sln propagation jobs.
        // the idea is to propagate sln changes when a view "occurs to the mind", i.e. becomes more salient in a group and is eligible for reduction in that group.
        // - when a view is now salient because the group becomes c-salient, no propagation;
        // - when a view is now salient because the group's sln_thr gets lower, no propagation;
        // - propagation can occur only if the group is c_active. For efficiency reasons, no propagation occurs even if some of the group's viewing groups are c-active and c-salient.
        if (state->is_c_active) {
            _initiate_sln_propagation(view->object, view_new_sln - view_old_sln, get_sln_thr());
        }
    }
}